

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_ppmd8.c
# Opt level: O1

void RestoreModel(CPpmd8 *p,CTX_PTR c1)

{
  int *piVar1;
  Byte *pBVar2;
  Byte *pBVar3;
  byte bVar4;
  ushort uVar5;
  UInt32 UVar6;
  long lVar7;
  uint uVar8;
  ulong uVar9;
  int *piVar10;
  CPpmd_Void_Ref *pCVar11;
  CTX_PTR ctx;
  int local_b8 [40];
  
  p->Text = p->Base + p->AlignOffset;
  for (ctx = p->MaxContext; ctx != c1; ctx = (CTX_PTR)(p->Base + ctx->Suffix)) {
    bVar4 = ctx->NumStats - 1;
    ctx->NumStats = bVar4;
    if (bVar4 == 0) {
      pBVar2 = p->Base;
      uVar9 = (ulong)ctx->Stats;
      pBVar3 = pBVar2 + uVar9;
      ctx->Flags = (0x3f < pBVar2[uVar9]) << 3 | ctx->Flags & 0x10;
      *(undefined2 *)((long)&ctx->Stats + 2) = *(undefined2 *)(pBVar2 + uVar9 + 4);
      *(undefined4 *)&ctx->SummFreq = *(undefined4 *)(pBVar2 + uVar9);
      if (p->UnitsStart == pBVar3) {
        p->UnitsStart = p->UnitsStart + 0xc;
      }
      else {
        pBVar3[0] = 0xff;
        pBVar3[1] = 0xff;
        pBVar3[2] = 0xff;
        pBVar3[3] = 0xff;
        *(CPpmd_Void_Ref *)(pBVar3 + 4) = p->FreeList[0];
        *(uint *)(pBVar3 + 8) = (uint)p->Indx2Units[0];
        p->FreeList[0] = (int)pBVar3 - *(int *)&p->Base;
        p->Stamps[0] = p->Stamps[0] + 1;
      }
      *(char *)((long)&ctx->SummFreq + 1) = (char)(*(byte *)((long)&ctx->SummFreq + 1) + 0xb >> 3);
    }
    else {
      Refresh(p,ctx,bVar4 + 3 >> 1,0);
    }
  }
  for (; ctx != p->MinContext; ctx = (CTX_PTR)(p->Base + ctx->Suffix)) {
    bVar4 = ctx->NumStats;
    if (bVar4 == 0) {
      bVar4 = *(byte *)((long)&ctx->SummFreq + 1);
      *(byte *)((long)&ctx->SummFreq + 1) = bVar4 - (bVar4 >> 1);
    }
    else {
      uVar5 = ctx->SummFreq + 4;
      ctx->SummFreq = uVar5;
      if ((ushort)((ushort)bVar4 * 4 + 0x80) < uVar5) {
        Refresh(p,ctx,bVar4 + 2 >> 1,1);
      }
    }
  }
  if ((p->RestoreMethod == 0) || (UVar6 = GetUsedMemory(p), UVar6 < p->Size >> 1)) {
    RestartModel(p);
    return;
  }
  uVar8 = p->MaxContext->Suffix;
  if (uVar8 != 0) {
    do {
      uVar9 = (ulong)uVar8;
      uVar8 = *(uint *)(p->Base + uVar9 + 8);
    } while (uVar8 != 0);
    p->MaxContext = (CPpmd8_Context *)(p->Base + uVar9);
  }
  do {
    CutOff(p,p->MaxContext,0);
    memset(local_b8,0,0x98);
    pBVar3 = p->LoUnit;
    if (pBVar3 != p->HiUnit) {
      pBVar3[0] = '\0';
      pBVar3[1] = '\0';
      pBVar3[2] = '\0';
      pBVar3[3] = '\0';
    }
    for (piVar10 = (int *)p->UnitsStart; *piVar10 == -1; piVar10 = piVar10 + (ulong)uVar8 * 3) {
      *piVar10 = 0;
      uVar8 = piVar10[2];
      local_b8[p->Units2Indx[uVar8 - 1]] = local_b8[p->Units2Indx[uVar8 - 1]] + 1;
    }
    p->UnitsStart = (Byte *)piVar10;
    lVar7 = 0;
    do {
      if (local_b8[lVar7] != 0) {
        pCVar11 = p->FreeList + lVar7;
        pBVar3 = p->Base;
        do {
          piVar10 = (int *)(pBVar3 + *pCVar11);
          do {
            if (*piVar10 != 0) break;
            uVar8 = piVar10[1];
            *pCVar11 = uVar8;
            p->Stamps[lVar7] = p->Stamps[lVar7] - 1;
            piVar10 = (int *)(pBVar3 + uVar8);
            piVar1 = local_b8 + lVar7;
            *piVar1 = *piVar1 + -1;
          } while (*piVar1 != 0);
          pCVar11 = (CPpmd_Void_Ref *)(piVar10 + 1);
        } while (local_b8[lVar7] != 0);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != 0x26);
    UVar6 = GetUsedMemory(p);
    if (UVar6 <= (p->Size >> 2) * 3) {
      p->GlueCount = 0;
      p->OrderFall = p->MaxOrder;
      return;
    }
  } while( true );
}

Assistant:

static void RestoreModel(CPpmd8 *p, CTX_PTR c1
    #ifdef PPMD8_FREEZE_SUPPORT
    , CTX_PTR fSuccessor
    #endif
    )
{
  CTX_PTR c;
  CPpmd_State *s;
  RESET_TEXT(0);
  for (c = p->MaxContext; c != c1; c = SUFFIX(c))
    if (--(c->NumStats) == 0)
    {
      s = STATS(c);
      c->Flags = (Byte)((c->Flags & 0x10) + 0x08 * (s->Symbol >= 0x40));
      *ONE_STATE(c) = *s;
      SpecialFreeUnit(p, s);
      ONE_STATE(c)->Freq = (Byte)(((unsigned)ONE_STATE(c)->Freq + 11) >> 3);
    }
    else
      Refresh(p, c, (c->NumStats+3) >> 1, 0);
 
  for (; c != p->MinContext; c = SUFFIX(c))
    if (!c->NumStats)
      ONE_STATE(c)->Freq = (Byte)(ONE_STATE(c)->Freq - (ONE_STATE(c)->Freq >> 1));
    else if ((c->SummFreq += 4) > 128 + 4 * c->NumStats)
      Refresh(p, c, (c->NumStats + 2) >> 1, 1);

  #ifdef PPMD8_FREEZE_SUPPORT
  if (p->RestoreMethod > PPMD8_RESTORE_METHOD_FREEZE)
  {
    p->MaxContext = fSuccessor;
    p->GlueCount += !(p->Stamps[1] & 1);
  }
  else if (p->RestoreMethod == PPMD8_RESTORE_METHOD_FREEZE)
  {
    while (p->MaxContext->Suffix)
      p->MaxContext = SUFFIX(p->MaxContext);
    RemoveBinContexts(p, p->MaxContext, 0);
    p->RestoreMethod++;
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
  else
  #endif
  if (p->RestoreMethod == PPMD8_RESTORE_METHOD_RESTART || GetUsedMemory(p) < (p->Size >> 1))
    RestartModel(p);
  else
  {
    while (p->MaxContext->Suffix)
      p->MaxContext = SUFFIX(p->MaxContext);
    do
    {
      CutOff(p, p->MaxContext, 0);
      ExpandTextArea(p);
    }
    while (GetUsedMemory(p) > 3 * (p->Size >> 2));
    p->GlueCount = 0;
    p->OrderFall = p->MaxOrder;
  }
}